

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.cpp
# Opt level: O0

void __thiscall Kuhn::Game::step(Game *this,int action)

{
  value_type_conflict2 vVar1;
  value_type_conflict2 vVar2;
  int iVar3;
  int iVar4;
  reference pvVar5;
  size_type sVar6;
  iterator pvVar7;
  iterator pvVar8;
  iterator pvVar9;
  int *piVar10;
  reference pvVar11;
  reference pvVar12;
  reference pvVar13;
  iterator __first;
  iterator __first_00;
  iterator __last;
  bool bVar14;
  int local_ac;
  int i_7;
  size_t winPlayer_2;
  value_type_conflict local_97;
  array<bool,_2UL> local_96;
  int i_6;
  array<bool,_2UL> isBet;
  array<int,_2UL> card;
  int i_5;
  int i_4;
  size_t winPlayer_1;
  int i_3;
  size_t winPlayer;
  int local_60;
  bool terminalPass;
  int i_2;
  int opponents [1];
  int player;
  int plays;
  uint8_t (*infoSet) [10];
  uint8_t (*__end1) [10];
  uint8_t (*__begin1) [10];
  uint8_t (*__range1) [2] [10];
  int i_1;
  int tmp;
  int c2;
  int c1;
  int a;
  int i;
  int ChanceAN;
  int action_local;
  Game *this_local;
  
  if (this->mCurrentPlayer == 3) {
    this->mChanceProbability = 0.16666666666666666;
    for (c1 = 0; c1 < 3; c1 = c1 + 1) {
      pvVar5 = std::array<int,_3UL>::operator[](&this->mCards,(long)c1);
      *pvVar5 = c1;
    }
    sVar6 = std::array<int,_3UL>::size(&this->mCards);
    c2 = action;
    iVar3 = (int)sVar6;
    while (tmp = iVar3 + -1, 0 < tmp) {
      pvVar5 = std::array<int,_3UL>::operator[](&this->mCards,(long)tmp);
      vVar1 = *pvVar5;
      pvVar5 = std::array<int,_3UL>::operator[](&this->mCards,(long)(c2 % iVar3));
      vVar2 = *pvVar5;
      pvVar5 = std::array<int,_3UL>::operator[](&this->mCards,(long)tmp);
      *pvVar5 = vVar2;
      pvVar5 = std::array<int,_3UL>::operator[](&this->mCards,(long)(c2 % iVar3));
      *pvVar5 = vVar1;
      c2 = c2 / iVar3;
      iVar3 = tmp;
    }
    for (__range1._0_4_ = 0; (int)__range1 < 2; __range1._0_4_ = (int)__range1 + 1) {
      pvVar5 = std::array<int,_3UL>::operator[](&this->mCards,(long)(int)__range1);
      this->mInfoSets[(int)__range1][0] = (uint8_t)*pvVar5;
    }
    this->mTurnNum = 0;
    this->mCurrentPlayer = 0;
    this->mFirstBetTurn = -1;
    this->mBetPlayerNum = 0;
    this->mDone = false;
  }
  else {
    this->mTurnNum = this->mTurnNum + 1;
    this->mBetPlayerNum = action + this->mBetPlayerNum;
    for (__end1 = this->mInfoSets; __end1 != (uint8_t (*) [10])&this->field_0x59;
        __end1 = __end1 + 1) {
      (*__end1)[this->mTurnNum] = (uint8_t)action;
    }
    if ((this->mFirstBetTurn == -1) && (action == 1)) {
      this->mFirstBetTurn = this->mTurnNum;
    }
    opponents[0] = this->mTurnNum;
    i_2 = opponents[0] % 2;
    for (local_60 = 0; local_60 < 1; local_60 = local_60 + 1) {
      *(int *)(&stack0xffffffffffffffa4 + (long)local_60 * 4) = (i_2 + local_60 + 1) % 2;
    }
    if (1 < opponents[0]) {
      if ((((this->mFirstBetTurn < 1) || (bVar14 = true, this->mTurnNum - this->mFirstBetTurn != 1))
          && (bVar14 = false, this->mTurnNum == 2)) && (bVar14 = false, this->mFirstBetTurn == -1))
      {
        bVar14 = this->mInfoSets[0][this->mTurnNum] == '\0';
      }
      if (this->mBetPlayerNum == 2) {
        pvVar7 = std::array<int,_3UL>::begin(&this->mCards);
        pvVar8 = std::array<int,_3UL>::begin(&this->mCards);
        pvVar9 = std::array<int,_3UL>::begin(&this->mCards);
        piVar10 = std::max_element<int*>(pvVar8,pvVar9 + 2);
        sVar6 = std::distance<int*>(pvVar7,piVar10);
        pvVar11 = std::array<double,_2UL>::operator[](&this->mPayoff,sVar6);
        *pvVar11 = 2.0;
        for (winPlayer_1._4_4_ = 0; winPlayer_1._4_4_ < 2; winPlayer_1._4_4_ = winPlayer_1._4_4_ + 1
            ) {
          if ((long)winPlayer_1._4_4_ != sVar6) {
            pvVar11 = std::array<double,_2UL>::operator[](&this->mPayoff,(long)winPlayer_1._4_4_);
            *pvVar11 = -2.0;
          }
        }
        this->mDone = true;
      }
      else if (bVar14) {
        if (this->mBetPlayerNum == 0) {
          pvVar7 = std::array<int,_3UL>::begin(&this->mCards);
          pvVar8 = std::array<int,_3UL>::begin(&this->mCards);
          pvVar9 = std::array<int,_3UL>::begin(&this->mCards);
          piVar10 = std::max_element<int*>(pvVar8,pvVar9 + 2);
          sVar6 = std::distance<int*>(pvVar7,piVar10);
          pvVar11 = std::array<double,_2UL>::operator[](&this->mPayoff,sVar6);
          *pvVar11 = 1.0;
          for (card._M_elems[1] = 0; card._M_elems[1] < 2; card._M_elems[1] = card._M_elems[1] + 1)
          {
            if ((long)card._M_elems[1] != sVar6) {
              pvVar11 = std::array<double,_2UL>::operator[](&this->mPayoff,(long)card._M_elems[1]);
              *pvVar11 = -1.0;
            }
          }
          this->mDone = true;
        }
        else if (this->mBetPlayerNum == 1) {
          pvVar11 = std::array<double,_2UL>::operator[](&this->mPayoff,(long)i_2);
          *pvVar11 = 1.0;
          for (card._M_elems[0] = 0; card._M_elems[0] < 2; card._M_elems[0] = card._M_elems[0] + 1)
          {
            if (card._M_elems[0] != i_2) {
              pvVar11 = std::array<double,_2UL>::operator[](&this->mPayoff,(long)card._M_elems[0]);
              *pvVar11 = -1.0;
            }
          }
          this->mDone = true;
        }
        else if (1 < this->mBetPlayerNum) {
          memset(&stack0xffffffffffffff70,0,8);
          i_6 = -1;
          std::array<int,_2UL>::fill((array<int,_2UL> *)&stack0xffffffffffffff70,&i_6);
          memset(&local_96,0,2);
          local_97 = false;
          std::array<bool,_2UL>::fill(&local_96,&local_97);
          for (winPlayer_2._4_4_ = 0; winPlayer_2._4_4_ < this->mTurnNum;
              winPlayer_2._4_4_ = winPlayer_2._4_4_ + 1) {
            if (this->mInfoSets[0][winPlayer_2._4_4_ + 1] == '\x01') {
              pvVar5 = std::array<int,_3UL>::operator[](&this->mCards,(long)(winPlayer_2._4_4_ % 2))
              ;
              vVar1 = *pvVar5;
              pvVar12 = std::array<int,_2UL>::operator[]
                                  ((array<int,_2UL> *)&stack0xffffffffffffff70,
                                   (long)(winPlayer_2._4_4_ % 2));
              *pvVar12 = vVar1;
              pvVar13 = std::array<bool,_2UL>::operator[](&local_96,(long)(winPlayer_2._4_4_ % 2));
              *pvVar13 = true;
            }
          }
          __first = std::array<int,_2UL>::begin((array<int,_2UL> *)&stack0xffffffffffffff70);
          __first_00 = std::array<int,_2UL>::begin((array<int,_2UL> *)&stack0xffffffffffffff70);
          __last = std::array<int,_2UL>::end((array<int,_2UL> *)&stack0xffffffffffffff70);
          piVar10 = std::max_element<int*>(__first_00,__last);
          sVar6 = std::distance<int*>(__first,piVar10);
          iVar3 = this->mBetPlayerNum;
          iVar4 = this->mBetPlayerNum;
          pvVar11 = std::array<double,_2UL>::operator[](&this->mPayoff,sVar6);
          *pvVar11 = (double)((iVar3 + -1) * 2 + (2 - iVar4));
          for (local_ac = 0; local_ac < 2; local_ac = local_ac + 1) {
            pvVar13 = std::array<bool,_2UL>::operator[](&local_96,(long)local_ac);
            if ((*pvVar13 & 1U) == 0) {
              pvVar11 = std::array<double,_2UL>::operator[](&this->mPayoff,(long)local_ac);
              *pvVar11 = -1.0;
            }
            else if ((long)local_ac != sVar6) {
              pvVar11 = std::array<double,_2UL>::operator[](&this->mPayoff,(long)local_ac);
              *pvVar11 = -2.0;
            }
          }
          this->mDone = true;
        }
      }
    }
    this->mCurrentPlayer = i_2;
  }
  return;
}

Assistant:

void Game::step(const int action) {
    // chance node action
    if (mCurrentPlayer == PlayerNum + 1) {
        constexpr int ChanceAN = ChanceActionNum();
        mChanceProbability = 1.0 / double(ChanceAN);
        for (int i = 0; i < CardNum; ++i) {
            mCards[i] = i;
        }
        // shuffle cards
        int a = action;
        for (int c1 = int(mCards.size()) - 1; c1 > 0; --c1) {
            const int c2 = a % (c1 + 1);
            const int tmp = mCards[c1];
            mCards[c1] = mCards[c2];
            mCards[c2] = tmp;
            a = (int) a / (c1 + 1);
        }
        for (int i = 0; i < PlayerNum; ++i) {
            mInfoSets[i][0] = mCards[i];
        }
        mTurnNum = 0;
        mCurrentPlayer = 0;
        mFirstBetTurn = -1;
        mBetPlayerNum = 0;
        mDone = false;
        return;
    }

    // update history
    mTurnNum += 1;
    mBetPlayerNum += action;
    for (auto &infoSet : mInfoSets) {
        infoSet[mTurnNum] = action;
    }
    if (mFirstBetTurn == -1 && action == 1) {
        mFirstBetTurn = mTurnNum;
    }

    // update payoff
    const int plays = mTurnNum;
    const int player = plays % PlayerNum;
    int opponents[PlayerNum - 1];
    for (int i = 0; i < PlayerNum - 1; ++i) {
        opponents[i] = (player + i + 1) % PlayerNum;
    }
    if (plays > 1) {
        const bool terminalPass = (mFirstBetTurn > 0 && (mTurnNum - mFirstBetTurn == PlayerNum - 1)) || (mTurnNum == PlayerNum && mFirstBetTurn == -1 && mInfoSets[0][mTurnNum] == 0);
        // all bet
        if (mBetPlayerNum == PlayerNum) {
            const size_t winPlayer = std::distance(mCards.begin(), std::max_element(mCards.begin(), mCards.begin() + PlayerNum));
            mPayoff[winPlayer] = 2 * (PlayerNum - 1);
            for (int i = 0; i < PlayerNum; ++i) {
                if (i == winPlayer) {
                    continue;
                }
                mPayoff[i] = -2;
            }
            mDone = true;
        } else if (terminalPass) {
            // all fold
            if (mBetPlayerNum == 0) {
                const size_t winPlayer = std::distance(mCards.begin(), std::max_element(mCards.begin(), mCards.begin() + PlayerNum));
                mPayoff[winPlayer] = PlayerNum - 1;
                for (int i = 0; i < PlayerNum; ++i) {
                    if (i == winPlayer) {
                        continue;
                    }
                    mPayoff[i] = -1;
                }
                mDone = true;
            }
            // only one player bet
            else if (mBetPlayerNum == 1) {
                mPayoff[player] = PlayerNum - 1;
                for (int i = 0; i < PlayerNum; ++i) {
                    if (i == player) {
                        continue;
                    }
                    mPayoff[i] = -1;
                }
                mDone = true;
            }
            // more than two players bet
            else if (mBetPlayerNum >= 2) {
                std::array<int, PlayerNum> card{};
                card.fill(-1);
                std::array<bool, PlayerNum> isBet{};
                isBet.fill(false);
                for (int i = 0; i < mTurnNum; ++i) {
                    if (mInfoSets[0][i + 1] == 1) {
                        card[i % PlayerNum] = mCards[i % PlayerNum];
                        isBet[i % PlayerNum] = true;
                    }
                }
                const size_t winPlayer = std::distance(card.begin(), std::max_element(card.begin(), card.end()));
                mPayoff[winPlayer] = 2 * (mBetPlayerNum - 1) + (PlayerNum - mBetPlayerNum);
                for (int i = 0; i < PlayerNum; ++i) {
                    if (!isBet[i]) {
                        mPayoff[i] = -1;
                        continue;
                    }
                    if (i == winPlayer) {
                        continue;
                    }
                    mPayoff[i] = -2;
                }
                mDone = true;
            }
        }
    }
    mCurrentPlayer = player;
}